

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

int Llb_Nonlin4NextPartitions(Llb_Mgr_t_conflict *p,Llb_Prt_t **ppPart1,Llb_Prt_t **ppPart2)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Llb_Prt_t *pLVar6;
  Llb_Prt_t *pLVar7;
  int iVar8;
  Llb_Var_t *pLVar9;
  Llb_Prt_t *pLVar10;
  Llb_Prt_t *pLVar11;
  
  Llb_Nonlin4CheckVars(p);
  uVar5 = 0;
  uVar4 = (ulong)(uint)p->nVars;
  if (p->nVars < 1) {
    uVar4 = uVar5;
  }
  pLVar9 = (Llb_Var_t *)0x0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pLVar1 = p->pVars[uVar5];
    if (((pLVar1 != (Llb_Var_t *)0x0) && ((p->nSizeMax == 0 || (pLVar1->nScore <= p->nSizeMax)))) &&
       ((pLVar9 == (Llb_Var_t *)0x0 || (pLVar1->nScore < pLVar9->nScore)))) {
      pLVar9 = pLVar1;
    }
  }
  if (pLVar9 == (Llb_Var_t *)0x0) {
    iVar8 = 0;
  }
  else {
    pLVar6 = (Llb_Prt_t *)0x0;
    pLVar10 = (Llb_Prt_t *)0x0;
    for (iVar8 = 0; iVar8 < pLVar9->vParts->nSize; iVar8 = iVar8 + 1) {
      iVar3 = Vec_IntEntry(pLVar9->vParts,iVar8);
      pLVar2 = p->pParts[iVar3];
      pLVar7 = pLVar6;
      pLVar11 = pLVar2;
      if ((pLVar10 != (Llb_Prt_t *)0x0) &&
         (pLVar7 = pLVar2, pLVar11 = pLVar10, pLVar6 != (Llb_Prt_t *)0x0)) {
        if (((pLVar2->nSize < pLVar10->nSize) || (pLVar7 = pLVar6, pLVar2->nSize < pLVar6->nSize))
           && (pLVar7 = pLVar6, pLVar11 = pLVar2, pLVar10->nSize <= pLVar6->nSize)) {
          pLVar7 = pLVar2;
          pLVar11 = pLVar10;
        }
      }
      pLVar6 = pLVar7;
      pLVar10 = pLVar11;
    }
    *ppPart1 = pLVar10;
    *ppPart2 = pLVar6;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Llb_Nonlin4NextPartitions( Llb_Mgr_t * p, Llb_Prt_t ** ppPart1, Llb_Prt_t ** ppPart2 )
{
    Llb_Var_t * pVar, * pVarBest = NULL;
    Llb_Prt_t * pPart, * pPart1Best = NULL, * pPart2Best = NULL;
    int i;
    Llb_Nonlin4CheckVars( p );
    // find variable with minimum score
    Llb_MgrForEachVar( p, pVar, i )
    {
        if ( p->nSizeMax && pVar->nScore > p->nSizeMax )
            continue;
//        if ( pVarBest == NULL || Vec_IntSize(pVarBest->vParts) * pVarBest->nScore > Vec_IntSize(pVar->vParts) * pVar->nScore )
        if ( pVarBest == NULL || pVarBest->nScore > pVar->nScore )
            pVarBest = pVar;
//        printf( "%d ", pVar->nScore );
    }
//printf( "\n" );
    if ( pVarBest == NULL )
        return 0;
    // find two partitions with minimum size
    Llb_VarForEachPart( p, pVarBest, pPart, i )
    {
        if ( pPart1Best == NULL )
            pPart1Best = pPart;
        else if ( pPart2Best == NULL )
            pPart2Best = pPart;
        else if ( pPart1Best->nSize > pPart->nSize || pPart2Best->nSize > pPart->nSize )
        {
            if ( pPart1Best->nSize > pPart2Best->nSize )
                pPart1Best = pPart;
            else
                pPart2Best = pPart;
        }
    }
//printf( "Selecting %d and parts %d and %d\n", pVarBest->iVar, pPart1Best->nSize, pPart2Best->nSize );
//Extra_bddPrintSupport( p->dd, pPart1Best->bFunc ); printf( "\n" );
//Extra_bddPrintSupport( p->dd, pPart2Best->bFunc ); printf( "\n" );

    *ppPart1 = pPart1Best;
    *ppPart2 = pPart2Best;
    return 1; 
}